

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall
re2::Regexp::ParseState::ParseCCCharacter
          (ParseState *this,StringPiece *s,Rune *rp,StringPiece *whole_class,RegexpStatus *status)

{
  bool bVar1;
  int iVar2;
  
  if (s->length_ == 0) {
    status->code_ = kRegexpMissingBracket;
    (status->error_arg_).ptr_ = whole_class->ptr_;
    (status->error_arg_).length_ = whole_class->length_;
    return false;
  }
  if ((0 < s->length_) && (*s->ptr_ == '\\')) {
    bVar1 = ParseEscape(s,rp,status,this->rune_max_);
    return bVar1;
  }
  iVar2 = StringPieceToRune(rp,s,status);
  return -1 < iVar2;
}

Assistant:

bool Regexp::ParseState::ParseCCCharacter(StringPiece* s, Rune *rp,
                                          const StringPiece& whole_class,
                                          RegexpStatus* status) {
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    return false;
  }

  // Allow regular escape sequences even though
  // many need not be escaped in this context.
  if (s->size() >= 1 && (*s)[0] == '\\')
    return ParseEscape(s, rp, status, rune_max_);

  // Otherwise take the next rune.
  return StringPieceToRune(rp, s, status) >= 0;
}